

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

void wasm::Literal::printDouble(ostream *o,double d)

{
  ostream *poVar1;
  uint64_t uVar2;
  char *pcVar3;
  
  if ((long)d < 0 && d == 0.0) {
    pcVar3 = "-0";
  }
  else {
    if (NAN(d)) {
      pcVar3 = "";
      if ((long)d < 0) {
        pcVar3 = "-";
      }
      poVar1 = std::operator<<(o,pcVar3);
      std::operator<<(poVar1,"nan");
      uVar2 = NaNPayload(d);
      if (uVar2 != 0) {
        poVar1 = std::operator<<(o,":0x");
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
      }
      return;
    }
    if ((ulong)ABS(d) < 0x7ff0000000000000) {
      pcVar3 = cashew::JSPrinter::numToString(d,true);
      if (*pcVar3 == '-') {
        if (pcVar3[1] == '.') {
          pcVar3 = pcVar3 + 1;
          std::operator<<(o,"-0");
        }
      }
      else if (*pcVar3 == '.') {
        std::operator<<(o,'0');
      }
    }
    else {
      pcVar3 = "inf";
      if ((long)d < 0) {
        pcVar3 = "-inf";
      }
    }
  }
  std::operator<<(o,pcVar3);
  return;
}

Assistant:

void Literal::printDouble(std::ostream& o, double d) {
  if (d == 0 && std::signbit(d)) {
    o << "-0";
    return;
  }
  if (std::isnan(d)) {
    const char* sign = std::signbit(d) ? "-" : "";
    o << sign << "nan";
    if (uint64_t payload = NaNPayload(d)) {
      o << ":0x" << std::hex << payload << std::dec;
    }
    return;
  }
  if (!std::isfinite(d)) {
    o << (std::signbit(d) ? "-inf" : "inf");
    return;
  }
  const char* text = cashew::JSPrinter::numToString(d);
  // spec interpreter hates floats starting with '.'
  if (text[0] == '.') {
    o << '0';
  } else if (text[0] == '-' && text[1] == '.') {
    o << "-0";
    text++;
  }
  o << text;
}